

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_array(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                   *this)

{
  json_sax_t *pjVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  const_iterator context;
  const_iterator pvVar6;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  string_t type;
  string last_token;
  string_t key;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *it;
  pair<unsigned_long,_int> size_and_type;
  undefined1 in_stack_000001ff;
  pair<unsigned_long,_int> *in_stack_00000200;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000208;
  undefined5 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe45;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  byte local_1b6;
  byte local_1b3;
  undefined1 in_stack_fffffffffffffe4f;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  input_format_t iVar7;
  char *in_stack_fffffffffffffe78;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__s;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *this_00;
  string *detail;
  input_format_t format;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  string local_138 [32];
  undefined4 local_118;
  allocator<char> local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  void *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [40];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  undefined1 local_20 [31];
  byte local_1;
  
  std::pair<unsigned_long,_int>::pair<unsigned_long,_int,_true>
            ((pair<unsigned_long,_int> *)local_20);
  bVar3 = get_ubjson_size_type(in_stack_00000208,in_stack_00000200,(bool)in_stack_000001ff);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    if (((in_RDI->input_format == bjdata) && (local_20._0_8_ != 0xffffffffffffffff)) &&
       ((local_20._8_4_ & 0x100) != 0)) {
      detail = (string *)(local_20 + 8);
      local_20._8_4_ = local_20._8_4_ & 0xfffffeff;
      this_00 = (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                 *)&in_RDI->bjd_types_map;
      context = std::
                array<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_11UL>
                ::begin((array<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_11UL>
                         *)0x27f0e9);
      pvVar6 = std::
               array<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_11UL>
               ::end((array<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_11UL>
                      *)0x27f0f8);
      local_28 = std::
                 lower_bound<std::pair<int,std::__cxx11::string>const*,int,nlohmann::json_abi_v3_11_3::detail::binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>::get_ubjson_array()::_lambda(std::pair<int,std::__cxx11::string>const&,int)_1_>
                           (context,pvVar6,detail);
      format = (input_format_t)((ulong)&local_51 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      std::allocator<char>::~allocator(&local_51);
      __s = local_28;
      pvVar6 = std::
               array<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_11UL>
               ::end((array<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_11UL>
                      *)0x27f167);
      uVar8 = true;
      if (__s != pvVar6) {
        uVar8 = local_28->first != local_20._8_4_;
      }
      if ((bool)uVar8 == false) {
        std::__cxx11::string::string(local_138,(string *)&local_28->second);
        uVar4 = (*(in_RDI->sax->
                  super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  )._vptr_json_sax[8])(in_RDI->sax,local_50);
        local_1b3 = 1;
        if ((uVar4 & 1) != 0) {
          iVar5 = (*(in_RDI->sax->
                    super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    )._vptr_json_sax[5])(in_RDI->sax,local_138);
          local_1b3 = (byte)iVar5 ^ 0xff;
        }
        if ((local_1b3 & 1) == 0) {
          if (local_20._8_4_ == 0x43) {
            local_20._8_4_ = 0x55;
          }
          std::__cxx11::string::operator=(local_50,"_ArrayData_");
          uVar4 = (*(in_RDI->sax->
                    super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    )._vptr_json_sax[8])(in_RDI->sax,local_50);
          local_1b6 = 1;
          if ((uVar4 & 1) != 0) {
            iVar5 = (*(in_RDI->sax->
                      super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      )._vptr_json_sax[10])(in_RDI->sax,local_20._0_8_);
            local_1b6 = (byte)iVar5 ^ 0xff;
          }
          if ((local_1b6 & 1) == 0) {
            for (local_140 = 0; local_140 < (ulong)local_20._0_8_; local_140 = local_140 + 1) {
              bVar3 = get_ubjson_value(this,size_and_type._12_4_);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                local_1 = 0;
                goto LAB_0027f64b;
              }
            }
            uVar4 = (*(in_RDI->sax->
                      super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      )._vptr_json_sax[0xb])();
            local_1 = 0;
            if ((uVar4 & 1) != 0) {
              iVar5 = (*(in_RDI->sax->
                        super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        )._vptr_json_sax[9])();
              local_1 = (byte)iVar5;
            }
            local_1 = local_1 & 1;
          }
          else {
            local_1 = 0;
          }
        }
        else {
          local_1 = 0;
        }
LAB_0027f64b:
        local_118 = 1;
        std::__cxx11::string::~string(local_138);
      }
      else {
        get_token_string(this_00);
        pjVar1 = in_RDI->sax;
        sVar2 = in_RDI->chars_read;
        iVar7 = in_RDI->input_format;
        std::operator+((char *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar8,in_stack_fffffffffffffe80));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar8,in_stack_fffffffffffffe80),(char *)__s,
                   (allocator<char> *)CONCAT44(iVar7,in_stack_fffffffffffffe70));
        exception_message(in_RDI,format,detail,(string *)context);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50);
        iVar5 = (*(pjVar1->
                  super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  )._vptr_json_sax[0xc])(pjVar1,sVar2,local_88,&stack0xffffffffffffff50);
        local_1 = (byte)iVar5 & 1;
        parse_error::~parse_error((parse_error *)0x27f2b6);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator(&local_111);
        std::__cxx11::string::~string(local_f0);
        local_118 = 1;
        std::__cxx11::string::~string(local_88);
      }
      std::__cxx11::string::~string(local_50);
    }
    else {
      if (local_20._0_8_ == 0xffffffffffffffff) {
        iVar5 = (*(in_RDI->sax->
                  super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  )._vptr_json_sax[10])(in_RDI->sax,0xffffffffffffffff);
        if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
          local_1 = 0;
          goto LAB_0027f80a;
        }
        while (in_RDI->current != 0x5d) {
          bVar3 = parse_ubjson_internal(in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            goto LAB_0027f80a;
          }
          get_ignore_noop((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                           *)CONCAT17(in_stack_fffffffffffffe47,
                                      CONCAT16(in_stack_fffffffffffffe46,
                                               CONCAT15(in_stack_fffffffffffffe45,
                                                        in_stack_fffffffffffffe40))));
        }
      }
      else {
        iVar5 = (*(in_RDI->sax->
                  super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  )._vptr_json_sax[10])(in_RDI->sax,local_20._0_8_);
        if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
          local_1 = 0;
          goto LAB_0027f80a;
        }
        if (local_20._8_4_ == 0) {
          for (local_150 = 0; local_150 < (ulong)local_20._0_8_; local_150 = local_150 + 1) {
            bVar3 = parse_ubjson_internal(in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f)
            ;
            if (((bVar3 ^ 0xffU) & 1) != 0) {
              local_1 = 0;
              goto LAB_0027f80a;
            }
          }
        }
        else if (local_20._8_4_ != 0x4e) {
          for (local_148 = 0; local_148 < (ulong)local_20._0_8_; local_148 = local_148 + 1) {
            bVar3 = get_ubjson_value(this,size_and_type._12_4_);
            if (((bVar3 ^ 0xffU) & 1) != 0) {
              local_1 = 0;
              goto LAB_0027f80a;
            }
          }
        }
      }
      iVar5 = (*(in_RDI->sax->
                super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                )._vptr_json_sax[0xb])();
      local_1 = (byte)iVar5 & 1;
    }
  }
  else {
    local_1 = 0;
  }
LAB_0027f80a:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_ubjson_array()
    {
        std::pair<std::size_t, char_int_type> size_and_type;
        if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_type(size_and_type)))
        {
            return false;
        }

        // if bit-8 of size_and_type.second is set to 1, encode bjdata ndarray as an object in JData annotated array format (https://github.com/NeuroJSON/jdata):
        // {"_ArrayType_" : "typeid", "_ArraySize_" : [n1, n2, ...], "_ArrayData_" : [v1, v2, ...]}

        if (input_format == input_format_t::bjdata && size_and_type.first != npos && (size_and_type.second & (1 << 8)) != 0)
        {
            size_and_type.second &= ~(static_cast<char_int_type>(1) << 8);  // use bit 8 to indicate ndarray, here we remove the bit to restore the type marker
            auto it = std::lower_bound(bjd_types_map.begin(), bjd_types_map.end(), size_and_type.second, [](const bjd_type & p, char_int_type t)
            {
                return p.first < t;
            });
            string_t key = "_ArrayType_";
            if (JSON_HEDLEY_UNLIKELY(it == bjd_types_map.end() || it->first != size_and_type.second))
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                        exception_message(input_format, "invalid byte: 0x" + last_token, "type"), nullptr));
            }

            string_t type = it->second; // sax->string() takes a reference
            if (JSON_HEDLEY_UNLIKELY(!sax->key(key) || !sax->string(type)))
            {
                return false;
            }

            if (size_and_type.second == 'C')
            {
                size_and_type.second = 'U';
            }

            key = "_ArrayData_";
            if (JSON_HEDLEY_UNLIKELY(!sax->key(key) || !sax->start_array(size_and_type.first) ))
            {
                return false;
            }

            for (std::size_t i = 0; i < size_and_type.first; ++i)
            {
                if (JSON_HEDLEY_UNLIKELY(!get_ubjson_value(size_and_type.second)))
                {
                    return false;
                }
            }

            return (sax->end_array() && sax->end_object());
        }

        if (size_and_type.first != npos)
        {
            if (JSON_HEDLEY_UNLIKELY(!sax->start_array(size_and_type.first)))
            {
                return false;
            }

            if (size_and_type.second != 0)
            {
                if (size_and_type.second != 'N')
                {
                    for (std::size_t i = 0; i < size_and_type.first; ++i)
                    {
                        if (JSON_HEDLEY_UNLIKELY(!get_ubjson_value(size_and_type.second)))
                        {
                            return false;
                        }
                    }
                }
            }
            else
            {
                for (std::size_t i = 0; i < size_and_type.first; ++i)
                {
                    if (JSON_HEDLEY_UNLIKELY(!parse_ubjson_internal()))
                    {
                        return false;
                    }
                }
            }
        }
        else
        {
            if (JSON_HEDLEY_UNLIKELY(!sax->start_array(static_cast<std::size_t>(-1))))
            {
                return false;
            }

            while (current != ']')
            {
                if (JSON_HEDLEY_UNLIKELY(!parse_ubjson_internal(false)))
                {
                    return false;
                }
                get_ignore_noop();
            }
        }

        return sax->end_array();
    }